

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

bool anon_unknown.dwarf_72e95::testVector(void)

{
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  bool bVar1;
  ErrorCode EVar2;
  ostream *poVar3;
  Value *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2e8;
  allocator<char> local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  iterator local_298;
  size_type local_290;
  undefined1 local_282;
  allocator<char> local_281 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  iterator local_258;
  size_type local_250;
  Value local_248;
  undefined1 local_21a;
  allocator<char> local_219;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  iterator local_1f0;
  size_type local_1e8;
  Value local_1e0;
  undefined4 local_1b4;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1ad;
  undefined1 local_1ac;
  allocator<char> local_1ab;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  string local_180 [32];
  string local_160 [32];
  iterator local_140;
  size_type local_138;
  undefined1 local_130 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  iterator local_e8;
  size_type local_e0;
  undefined1 local_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  Value local_98;
  Value local_60;
  undefined1 local_38 [8];
  Value v;
  
  Json::Value::Value((Value *)local_38,arrayValue);
  Json::Value::Value(&local_60,"Hello");
  Json::Value::append((Value *)local_38,&local_60);
  Json::Value::~Value(&local_60);
  Json::Value::Value(&local_98,"world!");
  Json::Value::append((Value *)local_38,&local_98);
  Json::Value::~Value(&local_98);
  Json::Value::Value((Value *)&l.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,"ignore");
  Json::Value::append((Value *)local_38,
                      (Value *)&l.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Json::Value::~Value((Value *)&l.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"default",
             (allocator<char> *)
             ((long)&expected.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  expected.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_e8 = &local_108;
  local_e0 = 1;
  this = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&expected.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this);
  __l_03._M_len = local_e0;
  __l_03._M_array = local_e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d8,__l_03,this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&expected.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_2e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8;
  do {
    local_2e8 = local_2e8 + -1;
    std::__cxx11::string::~string((string *)local_2e8);
  } while (local_2e8 != &local_108);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expected.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_1ac = 1;
  local_1a8 = &local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"Hello",&local_1a9);
  local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"world!",&local_1aa);
  local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"ignore",&local_1ab);
  local_1ac = 0;
  local_140 = &local_1a0;
  local_138 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1ad);
  __l_02._M_len = local_138;
  __l_02._M_array = local_140;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_130,__l_02,&local_1ad);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1ad);
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140;
  do {
    local_338 = local_338 + -1;
    std::__cxx11::string::~string((string *)local_338);
  } while (local_338 != &local_1a0);
  std::allocator<char>::~allocator(&local_1ab);
  std::allocator<char>::~allocator(&local_1aa);
  std::allocator<char>::~allocator(&local_1a9);
  EVar2 = std::
          function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
          ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                        *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_d8,(Value *)local_38);
  if (EVar2 == Success) {
    bVar1 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_d8,
                            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_130);
    if (bVar1) {
      Json::Value::Value(&local_1e0,2);
      this_00 = Json::Value::operator[]((Value *)local_38,1);
      Json::Value::operator=(this_00,&local_1e0);
      Json::Value::~Value(&local_1e0);
      local_21a = 1;
      local_218 = &local_210;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"default",&local_219);
      local_21a = 0;
      local_1f0 = &local_210;
      local_1e8 = 1;
      __l_01._M_len = 1;
      __l_01._M_array = local_1f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d8,__l_01);
      local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f0;
      do {
        local_3f0 = local_3f0 + -1;
        std::__cxx11::string::~string((string *)local_3f0);
      } while (local_3f0 != &local_210);
      std::allocator<char>::~allocator(&local_219);
      EVar2 = std::
              function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
              ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                            *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_d8,(Value *)local_38);
      if (EVar2 == InvalidString) {
        Json::Value::Value(&local_248,"Hello");
        Json::Value::operator=((Value *)local_38,&local_248);
        Json::Value::~Value(&local_248);
        local_282 = '\x01';
        local_281._1_8_ = &local_278;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"default",local_281)
        ;
        local_282 = '\0';
        local_258 = &local_278;
        local_250 = 1;
        __l_00._M_len = 1;
        __l_00._M_array = local_258;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8,__l_00);
        local_460 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_258;
        do {
          local_460 = local_460 + -1;
          std::__cxx11::string::~string((string *)local_460);
        } while (local_460 != &local_278);
        std::allocator<char>::~allocator(local_281);
        EVar2 = std::
                function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                              *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_d8,(Value *)local_38);
        if (EVar2 == InvalidArray) {
          local_2c0 = &local_2b8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2b8,"default",&local_2c1);
          local_298 = &local_2b8;
          local_290 = 1;
          __l._M_len = 1;
          __l._M_array = local_298;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8,__l);
          local_4c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_298;
          do {
            local_4c8 = local_4c8 + -1;
            std::__cxx11::string::~string((string *)local_4c8);
          } while (local_4c8 != &local_2b8);
          std::allocator<char>::~allocator(&local_2c1);
          EVar2 = std::
                  function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                  ::operator()((function<(anonymous_namespace)::ErrorCode_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*)>
                                *)(anonymous_namespace)::StringVectorHelper_abi_cxx11_,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_d8,(Value *)0x0);
          if (EVar2 == Success) {
            bVar1 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_d8);
            if (bVar1) {
              v.limit_._7_1_ = 1;
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "ASSERT_TRUE(l.empty()) failed on line ");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x14e);
              std::operator<<(poVar3,"\n");
              v.limit_._7_1_ = 0;
            }
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "ASSERT_TRUE(StringVectorHelper(l, nullptr) == ErrorCode::Success) failed on line "
                                    );
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x14d);
            std::operator<<(poVar3,"\n");
            v.limit_._7_1_ = 0;
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::InvalidArray) failed on line "
                                  );
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x14a);
          std::operator<<(poVar3,"\n");
          v.limit_._7_1_ = 0;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::InvalidString) failed on line "
                                );
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x146);
        std::operator<<(poVar3,"\n");
        v.limit_._7_1_ = 0;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(l == expected) failed on line ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x142);
      std::operator<<(poVar3,"\n");
      v.limit_._7_1_ = 0;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::Success) failed on line "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x141);
    std::operator<<(poVar3,"\n");
    v.limit_._7_1_ = 0;
  }
  local_1b4 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  Json::Value::~Value((Value *)local_38);
  return (bool)(v.limit_._7_1_ & 1);
}

Assistant:

bool testVector()
{
  Json::Value v(Json::arrayValue);
  v.append("Hello");
  v.append("world!");
  v.append("ignore");

  std::vector<std::string> l{ "default" };
  std::vector<std::string> expected{ "Hello", "world!", "ignore" };
  ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::Success);
  ASSERT_TRUE(l == expected);

  v[1] = 2;
  l = { "default" };
  ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::InvalidString);

  v = "Hello";
  l = { "default" };
  ASSERT_TRUE(StringVectorHelper(l, &v) == ErrorCode::InvalidArray);

  l = { "default" };
  ASSERT_TRUE(StringVectorHelper(l, nullptr) == ErrorCode::Success);
  ASSERT_TRUE(l.empty());

  return true;
}